

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O1

string * __thiscall TileWire::toString_abi_cxx11_(string *__return_storage_ptr__,TileWire *this)

{
  Type TVar1;
  State SVar2;
  pointer pcVar3;
  pointer pbVar4;
  int iVar5;
  pointer pbVar6;
  long lVar7;
  size_type *psVar8;
  
  pbVar4 = WIRE_SYMBOL_TABLE_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TVar1 = this->_type;
  if ((long)(int)TVar1 == 0) {
    lVar7 = (long)(int)this->_state1 + (long)(int)(this->super_Tile)._direction * 3;
    pbVar6 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7 + -1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = &pbVar4[lVar7 + -1]._M_string_length;
  }
  else if ((int)TVar1 < 3) {
    lVar7 = (long)(int)this->_state1 +
            (long)(int)(this->super_Tile)._direction * 3 + (long)(int)TVar1 * 0xc;
    pbVar6 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7 + -7;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = &pbVar4[lVar7 + -7]._M_string_length;
  }
  else {
    SVar2 = this->_state1;
    if (TVar1 == JUNCTION) {
      pbVar6 = WIRE_SYMBOL_TABLE_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)(int)SVar2 + 0x1d;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = &pbVar4[(long)(int)SVar2 + 0x1d]._M_string_length;
    }
    else {
      iVar5 = this->_state2 * 3 + SVar2 + 0x1d;
      pbVar6 = WIRE_SYMBOL_TABLE_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar5;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = &pbVar4[iVar5]._M_string_length;
    }
  }
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + *psVar8);
  return __return_storage_ptr__;
}

Assistant:

string TileWire::toString() const {
    if (_type == STRAIGHT) {
        return WIRE_SYMBOL_TABLE[_direction * 3 + _state1 - 1];
    } else if (_type < JUNCTION) {
        return WIRE_SYMBOL_TABLE[-6 + _type * 12 + _direction * 3 + _state1 - 1];
    } else if (_type == JUNCTION) {
        return WIRE_SYMBOL_TABLE[30 + _state1 - 1];
    } else {
        return WIRE_SYMBOL_TABLE[33 + _state1 - 1 + (_state2 - 1) * 3];
    }
}